

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGBShadeRow_C(uint8_t *src_argb,uint8_t *dst_argb,int width,uint32_t value)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  uVar4 = (ulong)(uint)width;
  if (width < 1) {
    uVar4 = uVar5;
  }
  for (; (int)uVar4 != (int)uVar5; uVar5 = uVar5 + 1) {
    uVar1 = src_argb[uVar5 * 4 + 1];
    uVar2 = src_argb[uVar5 * 4 + 2];
    uVar3 = src_argb[uVar5 * 4 + 3];
    dst_argb[uVar5 * 4] =
         (uint8_t)((uint)CONCAT11(src_argb[uVar5 * 4],src_argb[uVar5 * 4]) * (value & 0xff) * 0x101
                  >> 0x18);
    dst_argb[uVar5 * 4 + 1] =
         (uint8_t)((uint)CONCAT11(uVar1,uVar1) * (value >> 8 & 0xff) * 0x101 >> 0x18);
    dst_argb[uVar5 * 4 + 2] =
         (uint8_t)((uint)CONCAT11(uVar2,uVar2) * (value >> 0x10 & 0xff) * 0x101 >> 0x18);
    dst_argb[uVar5 * 4 + 3] =
         (uint8_t)((uint)CONCAT11(uVar3,uVar3) * (value >> 0x18) * 0x101 >> 0x18);
  }
  return;
}

Assistant:

void ARGBShadeRow_C(const uint8_t* src_argb,
                    uint8_t* dst_argb,
                    int width,
                    uint32_t value) {
  const uint32_t b_scale = REPEAT8(value & 0xff);
  const uint32_t g_scale = REPEAT8((value >> 8) & 0xff);
  const uint32_t r_scale = REPEAT8((value >> 16) & 0xff);
  const uint32_t a_scale = REPEAT8(value >> 24);

  int i;
  for (i = 0; i < width; ++i) {
    const uint32_t b = REPEAT8(src_argb[0]);
    const uint32_t g = REPEAT8(src_argb[1]);
    const uint32_t r = REPEAT8(src_argb[2]);
    const uint32_t a = REPEAT8(src_argb[3]);
    dst_argb[0] = SHADE(b, b_scale);
    dst_argb[1] = SHADE(g, g_scale);
    dst_argb[2] = SHADE(r, r_scale);
    dst_argb[3] = SHADE(a, a_scale);
    src_argb += 4;
    dst_argb += 4;
  }
}